

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.h
# Opt level: O1

void __thiscall chrono::ChLinkMaskLF::~ChLinkMaskLF(ChLinkMaskLF *this)

{
  ChLinkMask::~ChLinkMask(&this->super_ChLinkMask);
  operator_delete(this,0x28);
  return;
}

Assistant:

class ChApi ChLinkMaskLF : public ChLinkMask {
  public:
    /// Create a ChLinkMaskLF which has 7 scalar constraints of
    /// class ChConstraintTwoBodies(). This is useful in case it must
    /// be used for the ChLinkLock link.
    ChLinkMaskLF();
    ChLinkMaskLF(const ChLinkMaskLF& other) : ChLinkMask(other) {}

    /// Assignment operator.
    ChLinkMaskLF& operator=(const ChLinkMaskLF& other);

    /// Set all mask data at once
    void SetLockMask(bool x, bool y, bool z, bool e0, bool e1, bool e2, bool e3);

    /// Obtain the reference to specific scalar constraint data
    /// in the collection of this link mask.
    ChConstraintTwoBodies& Constr_X() { return *constraints[0]; }
    ChConstraintTwoBodies& Constr_Y() { return *constraints[1]; }
    ChConstraintTwoBodies& Constr_Z() { return *constraints[2]; }
    ChConstraintTwoBodies& Constr_E0() { return *constraints[3]; }
    ChConstraintTwoBodies& Constr_E1() { return *constraints[4]; }
    ChConstraintTwoBodies& Constr_E2() { return *constraints[5]; }
    ChConstraintTwoBodies& Constr_E3() { return *constraints[6]; }

    /// Method to allow serialization of transient data to archives.
    virtual void ArchiveOUT(ChArchiveOut& marchive) override;

    /// Method to allow deserialization of transient data from archives.
    virtual void ArchiveIN(ChArchiveIn& marchive) override;
}